

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_extensions
          (t_netstd_generator *this,ostream *out,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
          *types)

{
  t_map *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
  *pmVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  pointer ppVar5;
  t_type *ptVar6;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  t_list *local_350;
  t_list *tlist;
  t_set *local_328;
  t_set *tset;
  string local_318 [7];
  bool null_elm;
  string copy_elm;
  string local_2d8;
  byte local_2b2;
  byte local_2b1;
  undefined1 local_2b0 [6];
  bool null_val;
  bool null_key;
  string copy_val;
  string copy_key;
  t_map *tmap;
  allocator local_241;
  string local_240;
  undefined1 local_220 [8];
  string tmp_instance;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
  local_d8;
  iterator local_d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
  local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
  local_c0;
  const_iterator iter;
  undefined1 local_b0 [7];
  bool needs_typecast;
  string local_90;
  string local_70;
  string local_40 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
  *local_20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
  *types_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = types;
  types_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
                 *)out;
  out_local = (ostream *)this;
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
          ::empty(types);
  if (!bVar2) {
    reset_indent(this);
    pmVar1 = types_local;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])();
    poVar4 = std::operator<<((ostream *)pmVar1,local_40);
    netstd_type_usings_abi_cxx11_(&local_70,this);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_40);
    start_netstd_namespace(this,(ostream *)types_local);
    pmVar1 = types_local;
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,"public static class ");
    make_valid_csharp_identifier
              ((string *)local_b0,this,
               &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar4 = std::operator<<(poVar4,(string *)local_b0);
    poVar4 = std::operator<<(poVar4,"Extensions");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)types_local);
    iter._M_node._7_1_ = 0;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
    ::_Rb_tree_const_iterator(&local_c0);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
         ::begin(types);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
    ::_Rb_tree_const_iterator(&local_c8,&local_d0);
    local_c0._M_node = local_c8._M_node;
    while( true ) {
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>_>
           ::end(types);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
      ::_Rb_tree_const_iterator(&local_d8,&local_e0);
      bVar2 = std::operator!=(&local_c0,&local_d8);
      pmVar1 = types_local;
      if (!bVar2) break;
      t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_100);
      poVar4 = std::operator<<(poVar4,"public static bool Equals(this ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
               ::operator->(&local_c0);
      poVar4 = std::operator<<(poVar4,(string *)ppVar5);
      poVar4 = std::operator<<(poVar4," instance, object that)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_100);
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)types_local);
      pmVar1 = types_local;
      t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_120);
      poVar4 = std::operator<<(poVar4,"if (!(that is ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
               ::operator->(&local_c0);
      poVar4 = std::operator<<(poVar4,(string *)ppVar5);
      poVar4 = std::operator<<(poVar4," other)) return false;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_120);
      pmVar1 = types_local;
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_140);
      poVar4 = std::operator<<(poVar4,"if (ReferenceEquals(instance, other)) return true;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_140);
      std::operator<<((ostream *)types_local,(string *)&::endl_abi_cxx11_);
      pmVar1 = types_local;
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_160);
      poVar4 = std::operator<<(poVar4,"return TCollections.Equals(instance, other);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_160);
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)types_local);
      poVar4 = std::operator<<((ostream *)types_local,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      pmVar1 = types_local;
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_180);
      poVar4 = std::operator<<(poVar4,"public static int GetHashCode(this ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
               ::operator->(&local_c0);
      poVar4 = std::operator<<(poVar4,(string *)ppVar5);
      poVar4 = std::operator<<(poVar4," instance)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_180);
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)types_local);
      pmVar1 = types_local;
      t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_1a0);
      poVar4 = std::operator<<(poVar4,"return TCollections.GetHashCode(instance);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1a0);
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)types_local);
      poVar4 = std::operator<<((ostream *)types_local,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      pmVar1 = types_local;
      if ((this->suppress_deepcopy & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_1c0);
        poVar4 = std::operator<<(poVar4,"public static ");
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                 ::operator->(&local_c0);
        poVar4 = std::operator<<(poVar4,(string *)ppVar5);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(string *)&DEEP_COPY_METHOD_NAME_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(this ");
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                 ::operator->(&local_c0);
        poVar4 = std::operator<<(poVar4,(string *)ppVar5);
        poVar4 = std::operator<<(poVar4," source)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1c0);
        t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)types_local);
        pmVar1 = types_local;
        t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_1e0);
        poVar4 = std::operator<<(poVar4,"if (source == null)");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1e0);
        t_generator::indent_up((t_generator *)this);
        pmVar1 = types_local;
        t_generator::indent_abi_cxx11_
                  ((string *)(tmp_instance.field_2._M_local_buf + 8),(t_generator *)this);
        poVar4 = std::operator<<((ostream *)pmVar1,(string *)(tmp_instance.field_2._M_local_buf + 8)
                                );
        poVar4 = std::operator<<(poVar4,"return null;");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(tmp_instance.field_2._M_local_buf + 8));
        t_generator::indent_down((t_generator *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_240,"tmp",&local_241);
        t_generator::tmp((string *)local_220,(t_generator *)this,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        pmVar1 = types_local;
        t_generator::indent_abi_cxx11_((string *)&tmap,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)pmVar1,(string *)&tmap);
        poVar4 = std::operator<<(poVar4,"var ");
        poVar4 = std::operator<<(poVar4,(string *)local_220);
        poVar4 = std::operator<<(poVar4," = new ");
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                 ::operator->(&local_c0);
        poVar4 = std::operator<<(poVar4,(string *)ppVar5);
        poVar4 = std::operator<<(poVar4,"(source.Count);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&tmap);
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                 ::operator->(&local_c0);
        uVar3 = (*(ppVar5->second->super_t_doc)._vptr_t_doc[0x10])();
        if ((uVar3 & 1) == 0) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                   ::operator->(&local_c0);
          uVar3 = (*(ppVar5->second->super_t_doc)._vptr_t_doc[0xf])();
          if ((uVar3 & 1) == 0) {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                     ::operator->(&local_c0);
            uVar3 = (*(ppVar5->second->super_t_doc)._vptr_t_doc[0xe])();
            if ((uVar3 & 1) == 0) goto LAB_003aa665;
          }
          std::__cxx11::string::string(local_318);
          tset._7_1_ = 0;
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                   ::operator->(&local_c0);
          uVar3 = (*(ppVar5->second->super_t_doc)._vptr_t_doc[0xf])();
          if ((uVar3 & 1) == 0) {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                     ::operator->(&local_c0);
            local_350 = (t_list *)ppVar5->second;
            ptVar6 = t_list::get_elem_type(local_350);
            get_deep_copy_method_call_abi_cxx11_
                      (&local_370,this,ptVar6,(bool *)((long)&iter._M_node + 7));
            std::__cxx11::string::operator=(local_318,(string *)&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            ptVar6 = t_list::get_elem_type(local_350);
            tset._7_1_ = type_can_be_null(ptVar6);
          }
          else {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                     ::operator->(&local_c0);
            local_328 = (t_set *)ppVar5->second;
            ptVar6 = t_set::get_elem_type(local_328);
            get_deep_copy_method_call_abi_cxx11_
                      ((string *)&tlist,this,ptVar6,(bool *)((long)&iter._M_node + 7));
            std::__cxx11::string::operator=(local_318,(string *)&tlist);
            std::__cxx11::string::~string((string *)&tlist);
            ptVar6 = t_set::get_elem_type(local_328);
            tset._7_1_ = type_can_be_null(ptVar6);
          }
          pmVar1 = types_local;
          t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
          poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_390);
          poVar4 = std::operator<<(poVar4,"foreach (var elem in source)");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_390);
          t_generator::indent_up((t_generator *)this);
          pmVar1 = types_local;
          t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
          poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_3b0);
          poVar4 = std::operator<<(poVar4,(string *)local_220);
          std::operator<<(poVar4,".Add(");
          std::__cxx11::string::~string((string *)&local_3b0);
          if ((tset._7_1_ & 1) == 0) {
            poVar4 = std::operator<<((ostream *)types_local,"elem");
            std::operator<<(poVar4,local_318);
          }
          else {
            poVar4 = std::operator<<((ostream *)types_local,"(elem != null) ? elem");
            poVar4 = std::operator<<(poVar4,local_318);
            std::operator<<(poVar4," : null");
          }
          poVar4 = std::operator<<((ostream *)types_local,");");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          t_generator::indent_down((t_generator *)this);
          std::__cxx11::string::~string(local_318);
        }
        else {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
                   ::operator->(&local_c0);
          this_00 = (t_map *)ppVar5->second;
          ptVar6 = t_map::get_key_type(this_00);
          get_deep_copy_method_call_abi_cxx11_
                    ((string *)((long)&copy_val.field_2 + 8),this,ptVar6,
                     (bool *)((long)&iter._M_node + 7));
          ptVar6 = t_map::get_val_type(this_00);
          get_deep_copy_method_call_abi_cxx11_
                    ((string *)local_2b0,this,ptVar6,(bool *)((long)&iter._M_node + 7));
          ptVar6 = t_map::get_key_type(this_00);
          local_2b1 = type_can_be_null(ptVar6);
          ptVar6 = t_map::get_val_type(this_00);
          local_2b2 = type_can_be_null(ptVar6);
          pmVar1 = types_local;
          t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
          poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_2d8);
          poVar4 = std::operator<<(poVar4,"foreach (var pair in source)");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_2d8);
          t_generator::indent_up((t_generator *)this);
          pmVar1 = types_local;
          t_generator::indent_abi_cxx11_
                    ((string *)((long)&copy_elm.field_2 + 8),(t_generator *)this);
          poVar4 = std::operator<<((ostream *)pmVar1,(string *)(copy_elm.field_2._M_local_buf + 8));
          poVar4 = std::operator<<(poVar4,(string *)local_220);
          std::operator<<(poVar4,".Add(");
          std::__cxx11::string::~string((string *)(copy_elm.field_2._M_local_buf + 8));
          if ((local_2b1 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)types_local,"pair.Key");
            std::operator<<(poVar4,(string *)(copy_val.field_2._M_local_buf + 8));
          }
          else {
            poVar4 = std::operator<<((ostream *)types_local,"(pair.Key != null) ? pair.Key");
            poVar4 = std::operator<<(poVar4,(string *)(copy_val.field_2._M_local_buf + 8));
            std::operator<<(poVar4," : null");
          }
          std::operator<<((ostream *)types_local,", ");
          if ((local_2b2 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)types_local,"pair.Value");
            std::operator<<(poVar4,(string *)local_2b0);
          }
          else {
            poVar4 = std::operator<<((ostream *)types_local,"(pair.Value != null) ? pair.Value");
            poVar4 = std::operator<<(poVar4,(string *)local_2b0);
            std::operator<<(poVar4," : null");
          }
          poVar4 = std::operator<<((ostream *)types_local,");");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          t_generator::indent_down((t_generator *)this);
          std::__cxx11::string::~string((string *)local_2b0);
          std::__cxx11::string::~string((string *)(copy_val.field_2._M_local_buf + 8));
        }
LAB_003aa665:
        pmVar1 = types_local;
        t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)pmVar1,(string *)&local_3d0);
        poVar4 = std::operator<<(poVar4,"return ");
        poVar4 = std::operator<<(poVar4,(string *)local_220);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3d0);
        t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)types_local);
        poVar4 = std::operator<<((ostream *)types_local,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_220);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_type_*>_>
      ::operator++(&local_c0);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)types_local);
    end_netstd_namespace(this,(ostream *)types_local);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_extensions(ostream& out, map<string, t_type*> types)
{
    if (types.empty())
    {
        return;
    }

    reset_indent();
    out << autogen_comment() << netstd_type_usings() << endl;

    start_netstd_namespace(out);

    out << indent() << "public static class " << make_valid_csharp_identifier(program_name_) << "Extensions" << endl;
    scope_up(out);

    bool needs_typecast = false;
    std::map<string,t_type*>::const_iterator iter;
    for( iter = types.begin(); iter != types.end(); ++iter)
    {
        out << indent() << "public static bool Equals(this " << iter->first << " instance, object that)" << endl;
        scope_up(out);
        out << indent() << "if (!(that is " << iter->first << " other)) return false;" << endl;
        out << indent() << "if (ReferenceEquals(instance, other)) return true;" << endl;
        out << endl;
        out << indent() << "return TCollections.Equals(instance, other);" << endl;
        scope_down(out);
        out << endl << endl;

        out << indent() << "public static int GetHashCode(this " << iter->first << " instance)" << endl;
        scope_up(out);
        out << indent() << "return TCollections.GetHashCode(instance);" << endl;
        scope_down(out);
        out << endl << endl;

        if(! suppress_deepcopy) {
            out << indent() << "public static " << iter->first << " " << DEEP_COPY_METHOD_NAME << "(this " << iter->first << " source)" << endl;
            scope_up(out);
            out << indent() << "if (source == null)" << endl;
            indent_up();
            out << indent() << "return null;" << endl << endl;
            indent_down();

            string tmp_instance = tmp("tmp");
            out << indent() << "var " << tmp_instance << " = new " << iter->first << "(source.Count);" << endl;
            if( iter->second->is_map())
            {
                t_map* tmap = static_cast<t_map*>(iter->second);
                string copy_key = get_deep_copy_method_call(tmap->get_key_type(), needs_typecast);
                string copy_val = get_deep_copy_method_call(tmap->get_val_type(), needs_typecast);
                bool null_key = type_can_be_null(tmap->get_key_type());
                bool null_val = type_can_be_null(tmap->get_val_type());

                out << indent() << "foreach (var pair in source)" << endl;
                indent_up();
                out << indent() << tmp_instance << ".Add(";
                if( null_key)
                {
                    out << "(pair.Key != null) ? pair.Key" << copy_key << " : null";
                } else {
                    out << "pair.Key" << copy_key;
                }
                out << ", ";
                if( null_val)
                {
                    out << "(pair.Value != null) ? pair.Value" << copy_val << " : null";
                } else {
                    out << "pair.Value" << copy_val;
                }
                out << ");" << endl;
                indent_down();

            } else if( iter->second->is_set() || iter->second->is_list()) {
                string copy_elm;
                bool null_elm = false;
                if (iter->second->is_set())
                {
                    t_set* tset = static_cast<t_set*>(iter->second);
                    copy_elm = get_deep_copy_method_call(tset->get_elem_type(), needs_typecast);
                    null_elm = type_can_be_null(tset->get_elem_type());
                }
                else // list
                {
                    t_list* tlist = static_cast<t_list*>(iter->second);
                    copy_elm = get_deep_copy_method_call(tlist->get_elem_type(), needs_typecast);
                    null_elm = type_can_be_null(tlist->get_elem_type());
                }

                out << indent() << "foreach (var elem in source)" << endl;
                indent_up();
                out << indent() << tmp_instance << ".Add(";
                if( null_elm)
                {
                    out << "(elem != null) ? elem" << copy_elm << " : null";
                } else {
                    out << "elem" << copy_elm;
                }
                out << ");" << endl;
                indent_down();
            }

            out << indent() << "return " << tmp_instance << ";" << endl;
            scope_down(out);
            out << endl << endl;
        }
    }


    scope_down(out);
    end_netstd_namespace(out);
}